

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerLdLen(Lowerer *this,Instr *instr,bool isHelper)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  PropertySym *sym;
  SymOpnd *newSrc;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x24c9,"(instr)","instr");
    if (!bVar2) goto LAB_00550845;
    *puVar3 = 0;
  }
  if (instr->m_opcode != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x24ca,"(instr->m_opcode == Js::OpCode::LdLen_A)",
                       "instr->m_opcode == Js::OpCode::LdLen_A");
    if (!bVar2) {
LAB_00550845:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(instr->m_src1);
  if (bVar2) {
    pRVar4 = IR::Opnd::AsRegOpnd(instr->m_src1);
    sym = PropertySym::FindOrCreate
                    ((pRVar4->m_sym->super_Sym).m_id,0xd1,0xffffffff,0xffffffff,PropertyKindData,
                     this->m_func);
    newSrc = IR::SymOpnd::New(&sym->super_Sym,TyVar,this->m_func);
    IR::Instr::ReplaceSrc1(instr,&newSrc->super_Opnd);
  }
  LowerLdFld(this,instr,HelperOp_GetProperty,HelperOp_GetProperty,false,(LabelInstr *)0x0,isHelper);
  return;
}

Assistant:

void Lowerer::LowerLdLen(IR::Instr *const instr, const bool isHelper)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdLen_A);

    // LdLen has persisted to this point for the sake of pre-lower opts.
    // Turn it into a LdFld of the "length" property.
    // This is normally a load of the internal "length" of an Array, so it probably doesn't benefit
    // from inline caching.

    if (instr->GetSrc1()->IsRegOpnd())
    {
        IR::RegOpnd * baseOpnd = instr->GetSrc1()->AsRegOpnd();
        PropertySym* fieldSym = PropertySym::FindOrCreate(baseOpnd->m_sym->m_id, Js::PropertyIds::length, (uint32)-1, (uint)-1, PropertyKindData, m_func);
        instr->ReplaceSrc1(IR::SymOpnd::New(fieldSym, TyVar, m_func));
    }
    LowerLdFld(instr, IR::HelperOp_GetProperty, IR::HelperOp_GetProperty, false, nullptr, isHelper);
}